

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number __thiscall chaiscript::Boxed_Number::get_as(Boxed_Number *this,Type_Info *inp_)

{
  bool bVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Boxed_Number *in_RSI;
  bad_any_cast *in_RDI;
  Boxed_Number BVar4;
  type_info *in_stack_ffffffffffffffc8;
  undefined2 uVar5;
  undefined6 uStack_26;
  
  uVar5 = SUB82(in_RDI,0);
  uStack_26 = (undefined6)((ulong)in_RDI >> 0x10);
  bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    get_as<int>((Boxed_Number *)in_stack_ffffffffffffffc8);
    Boxed_Number<int>((Boxed_Number *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    _Var3._M_pi = extraout_RDX;
  }
  else {
    bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
    if (bVar1) {
      get_as<double>((Boxed_Number *)in_stack_ffffffffffffffc8);
      Boxed_Number<double>((Boxed_Number *)in_RDI,(double)in_stack_ffffffffffffffc8);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
      if (bVar1) {
        get_as<float>((Boxed_Number *)in_stack_ffffffffffffffc8);
        Boxed_Number<float>((Boxed_Number *)in_RDI,(float)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                           );
        _Var3._M_pi = extraout_RDX_01;
      }
      else {
        bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
        if (bVar1) {
          get_as<long_double>((Boxed_Number *)in_stack_ffffffffffffffc8);
          Boxed_Number<long_double>(in_RSI,(longdouble)CONCAT28(uVar5,in_RDI));
          _Var3._M_pi = extraout_RDX_02;
        }
        else {
          bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
          if (bVar1) {
            get_as<char>((Boxed_Number *)in_stack_ffffffffffffffc8);
            Boxed_Number<char>((Boxed_Number *)in_RDI,
                               (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
            _Var3._M_pi = extraout_RDX_03;
          }
          else {
            bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
            if (bVar1) {
              get_as<unsigned_char>((Boxed_Number *)in_stack_ffffffffffffffc8);
              Boxed_Number<unsigned_char>
                        ((Boxed_Number *)in_RDI,(uchar)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
              _Var3._M_pi = extraout_RDX_04;
            }
            else {
              bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RDI,in_stack_ffffffffffffffc8)
              ;
              if (bVar1) {
                get_as<wchar_t>((Boxed_Number *)in_stack_ffffffffffffffc8);
                Boxed_Number<wchar_t>
                          ((Boxed_Number *)in_RDI,
                           (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
                _Var3._M_pi = extraout_RDX_05;
              }
              else {
                bVar1 = Type_Info::bare_equal_type_info
                                  ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                if (bVar1) {
                  get_as<char16_t>((Boxed_Number *)in_stack_ffffffffffffffc8);
                  Boxed_Number<char16_t>
                            ((Boxed_Number *)in_RDI,
                             (char16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30));
                  _Var3._M_pi = extraout_RDX_06;
                }
                else {
                  bVar1 = Type_Info::bare_equal_type_info
                                    ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                  if (bVar1) {
                    get_as<char32_t>((Boxed_Number *)in_stack_ffffffffffffffc8);
                    Boxed_Number<char32_t>
                              ((Boxed_Number *)in_RDI,
                               (char32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
                    _Var3._M_pi = extraout_RDX_07;
                  }
                  else {
                    bVar1 = Type_Info::bare_equal_type_info
                                      ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                    if (bVar1) {
                      get_as<unsigned_int>((Boxed_Number *)in_stack_ffffffffffffffc8);
                      Boxed_Number<unsigned_int>
                                ((Boxed_Number *)in_RDI,
                                 (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
                      _Var3._M_pi = extraout_RDX_08;
                    }
                    else {
                      bVar1 = Type_Info::bare_equal_type_info
                                        ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                      if (bVar1) {
                        get_as<long>((Boxed_Number *)in_stack_ffffffffffffffc8);
                        Boxed_Number<long>((Boxed_Number *)in_RDI,(long)in_stack_ffffffffffffffc8);
                        _Var3._M_pi = extraout_RDX_09;
                      }
                      else {
                        bVar1 = Type_Info::bare_equal_type_info
                                          ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                        if (bVar1) {
                          get_as<long_long>((Boxed_Number *)in_stack_ffffffffffffffc8);
                          Boxed_Number<long_long>
                                    ((Boxed_Number *)in_RDI,(longlong)in_stack_ffffffffffffffc8);
                          _Var3._M_pi = extraout_RDX_10;
                        }
                        else {
                          bVar1 = Type_Info::bare_equal_type_info
                                            ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                          if (bVar1) {
                            get_as<unsigned_long>((Boxed_Number *)in_stack_ffffffffffffffc8);
                            Boxed_Number<unsigned_long>
                                      ((Boxed_Number *)in_RDI,
                                       (unsigned_long)in_stack_ffffffffffffffc8);
                            _Var3._M_pi = extraout_RDX_11;
                          }
                          else {
                            bVar1 = Type_Info::bare_equal_type_info
                                              ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                            if (bVar1) {
                              get_as<unsigned_long_long>((Boxed_Number *)in_stack_ffffffffffffffc8);
                              Boxed_Number<unsigned_long_long>
                                        ((Boxed_Number *)in_RDI,
                                         (unsigned_long_long)in_stack_ffffffffffffffc8);
                              _Var3._M_pi = extraout_RDX_12;
                            }
                            else {
                              bVar1 = Type_Info::bare_equal_type_info
                                                ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                              if (bVar1) {
                                get_as<signed_char>((Boxed_Number *)in_stack_ffffffffffffffc8);
                                Boxed_Number<signed_char>
                                          ((Boxed_Number *)in_RDI,
                                           (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
                                _Var3._M_pi = extraout_RDX_13;
                              }
                              else {
                                bVar1 = Type_Info::bare_equal_type_info
                                                  ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                                if (bVar1) {
                                  get_as<short>((Boxed_Number *)in_stack_ffffffffffffffc8);
                                  Boxed_Number<short>((Boxed_Number *)in_RDI,
                                                      (short)((ulong)in_stack_ffffffffffffffc8 >>
                                                             0x30));
                                  _Var3._M_pi = extraout_RDX_14;
                                }
                                else {
                                  bVar1 = Type_Info::bare_equal_type_info
                                                    ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8);
                                  if (bVar1) {
                                    get_as<int>((Boxed_Number *)in_stack_ffffffffffffffc8);
                                    Boxed_Number<int>((Boxed_Number *)in_RDI,
                                                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20
                                                           ));
                                    _Var3._M_pi = extraout_RDX_15;
                                  }
                                  else {
                                    bVar1 = Type_Info::bare_equal_type_info
                                                      ((Type_Info *)in_RDI,in_stack_ffffffffffffffc8
                                                      );
                                    if (bVar1) {
                                      get_as<long>((Boxed_Number *)in_stack_ffffffffffffffc8);
                                      Boxed_Number<long>((Boxed_Number *)in_RDI,
                                                         (long)in_stack_ffffffffffffffc8);
                                      _Var3._M_pi = extraout_RDX_16;
                                    }
                                    else {
                                      bVar1 = Type_Info::bare_equal_type_info
                                                        ((Type_Info *)in_RDI,
                                                         in_stack_ffffffffffffffc8);
                                      if (bVar1) {
                                        get_as<unsigned_char>
                                                  ((Boxed_Number *)in_stack_ffffffffffffffc8);
                                        Boxed_Number<unsigned_char>
                                                  ((Boxed_Number *)in_RDI,
                                                   (uchar)((ulong)in_stack_ffffffffffffffc8 >> 0x38)
                                                  );
                                        _Var3._M_pi = extraout_RDX_17;
                                      }
                                      else {
                                        bVar1 = Type_Info::bare_equal_type_info
                                                          ((Type_Info *)in_RDI,
                                                           in_stack_ffffffffffffffc8);
                                        if (bVar1) {
                                          get_as<unsigned_short>
                                                    ((Boxed_Number *)in_stack_ffffffffffffffc8);
                                          Boxed_Number<unsigned_short>
                                                    ((Boxed_Number *)in_RDI,
                                                     (unsigned_short)
                                                     ((ulong)in_stack_ffffffffffffffc8 >> 0x30));
                                          _Var3._M_pi = extraout_RDX_18;
                                        }
                                        else {
                                          bVar1 = Type_Info::bare_equal_type_info
                                                            ((Type_Info *)in_RDI,
                                                             in_stack_ffffffffffffffc8);
                                          if (bVar1) {
                                            get_as<unsigned_int>
                                                      ((Boxed_Number *)in_stack_ffffffffffffffc8);
                                            Boxed_Number<unsigned_int>
                                                      ((Boxed_Number *)in_RDI,
                                                       (uint)((ulong)in_stack_ffffffffffffffc8 >>
                                                             0x20));
                                            _Var3._M_pi = extraout_RDX_19;
                                          }
                                          else {
                                            bVar1 = Type_Info::bare_equal_type_info
                                                              ((Type_Info *)in_RDI,
                                                               in_stack_ffffffffffffffc8);
                                            if (!bVar1) {
                                              uVar2 = __cxa_allocate_exception(0x28);
                                              chaiscript::detail::exception::bad_any_cast::
                                              bad_any_cast(in_RDI);
                                              __cxa_throw(uVar2,&chaiscript::detail::exception::
                                                                 bad_any_cast::typeinfo,
                                                          chaiscript::detail::exception::
                                                          bad_any_cast::~bad_any_cast);
                                            }
                                            get_as<unsigned_long>
                                                      ((Boxed_Number *)in_stack_ffffffffffffffc8);
                                            Boxed_Number<unsigned_long>
                                                      ((Boxed_Number *)in_RDI,
                                                       (unsigned_long)in_stack_ffffffffffffffc8);
                                            _Var3._M_pi = extraout_RDX_20;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  BVar4.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._2_6_ = uStack_26;
  BVar4.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_2_ = uVar5;
  BVar4.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  return (Boxed_Number)
         BVar4.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Number get_as(const Type_Info &inp_) const
      {
        if (inp_.bare_equal_type_info(typeid(int))) {
          return Boxed_Number(get_as<int>());
        } else if (inp_.bare_equal_type_info(typeid(double))) {
          return Boxed_Number(get_as<double>());
        } else if (inp_.bare_equal_type_info(typeid(float))) {
          return Boxed_Number(get_as<float>());
        } else if (inp_.bare_equal_type_info(typeid(long double))) {
          return Boxed_Number(get_as<long double>());
        } else if (inp_.bare_equal_type_info(typeid(char))) {
          return Boxed_Number(get_as<char>());
        } else if (inp_.bare_equal_type_info(typeid(unsigned char))) {
          return Boxed_Number(get_as<unsigned char>());
        } else if (inp_.bare_equal_type_info(typeid(wchar_t))) {
          return Boxed_Number(get_as<wchar_t>());
        } else if (inp_.bare_equal_type_info(typeid(char16_t))) {
          return Boxed_Number(get_as<char16_t>());
        } else if (inp_.bare_equal_type_info(typeid(char32_t))) {
          return Boxed_Number(get_as<char32_t>());
        } else if (inp_.bare_equal_type_info(typeid(unsigned int))) {
          return Boxed_Number(get_as<unsigned int>());
        } else if (inp_.bare_equal_type_info(typeid(long))) {
          return Boxed_Number(get_as<long>());
        } else if (inp_.bare_equal_type_info(typeid(long long))) {
          return Boxed_Number(get_as<long long>());
        } else if (inp_.bare_equal_type_info(typeid(unsigned long))) {
          return Boxed_Number(get_as<unsigned long>());
        } else if (inp_.bare_equal_type_info(typeid(unsigned long long))) {
          return Boxed_Number(get_as<unsigned long long>());
        } else if (inp_.bare_equal_type_info(typeid(int8_t))) {
          return Boxed_Number(get_as<int8_t>());
        } else if (inp_.bare_equal_type_info(typeid(int16_t))) {
          return Boxed_Number(get_as<int16_t>());
        } else if (inp_.bare_equal_type_info(typeid(int32_t))) {
          return Boxed_Number(get_as<int32_t>());
        } else if (inp_.bare_equal_type_info(typeid(int64_t))) {
          return Boxed_Number(get_as<int64_t>());
        } else if (inp_.bare_equal_type_info(typeid(uint8_t))) {
          return Boxed_Number(get_as<uint8_t>());
        } else if (inp_.bare_equal_type_info(typeid(uint16_t))) {
          return Boxed_Number(get_as<uint16_t>());
        } else if (inp_.bare_equal_type_info(typeid(uint32_t))) {
          return Boxed_Number(get_as<uint32_t>());
        } else if (inp_.bare_equal_type_info(typeid(uint64_t))) {
          return Boxed_Number(get_as<uint64_t>());
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }

      }